

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::
unordered_flat_set<std::basic_string_view<char,std::char_traits<char>>,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::insert<std::basic_string_view<char,std::char_traits<char>>const*>
          (unordered_flat_set<std::basic_string_view<char,std::char_traits<char>>,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *last)

{
  long lVar1;
  char *pcVar2;
  size_t len;
  char *key;
  long lVar3;
  ulong uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  uint64_t hash;
  uint uVar10;
  basic_string_view<char,_std::char_traits<char>_> *pos;
  ulong pos0;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  value_type *elements;
  locator res;
  locator local_48;
  
  if (first != last) {
    do {
      len = first->_M_len;
      key = first->_M_str;
      hash = slang::detail::hashing::hash(key,len);
      pos0 = hash >> ((byte)*this & 0x3f);
      lVar3 = *(long *)(this + 0x10);
      lVar1 = (hash & 0xff) * 4;
      cVar5 = (&UNK_0047c76c)[lVar1];
      cVar6 = (&UNK_0047c76d)[lVar1];
      cVar7 = (&UNK_0047c76e)[lVar1];
      cVar8 = (&UNK_0047c76f)[lVar1];
      lVar1 = *(long *)(this + 0x18);
      uVar4 = *(ulong *)(this + 8);
      uVar13 = 0;
      uVar12 = pos0;
      do {
        pcVar2 = (char *)(lVar3 + uVar12 * 0x10);
        auVar16[0] = -(*pcVar2 == cVar5);
        auVar16[1] = -(pcVar2[1] == cVar6);
        auVar16[2] = -(pcVar2[2] == cVar7);
        auVar16[3] = -(pcVar2[3] == cVar8);
        auVar16[4] = -(pcVar2[4] == cVar5);
        auVar16[5] = -(pcVar2[5] == cVar6);
        auVar16[6] = -(pcVar2[6] == cVar7);
        auVar16[7] = -(pcVar2[7] == cVar8);
        auVar16[8] = -(pcVar2[8] == cVar5);
        auVar16[9] = -(pcVar2[9] == cVar6);
        auVar16[10] = -(pcVar2[10] == cVar7);
        auVar16[0xb] = -(pcVar2[0xb] == cVar8);
        auVar16[0xc] = -(pcVar2[0xc] == cVar5);
        auVar16[0xd] = -(pcVar2[0xd] == cVar6);
        auVar16[0xe] = -(pcVar2[0xe] == cVar7);
        auVar16[0xf] = -(pcVar2[0xf] == cVar8);
        uVar10 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
        if (uVar10 != 0) {
          lVar11 = lVar1 + uVar12 * 0xf0;
          do {
            iVar9 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
              }
            }
            bVar15 = len == *(size_t *)(lVar11 + (ulong)(uint)(iVar9 << 4));
            lVar14 = lVar11 + (ulong)(uint)(iVar9 << 4);
            if (bVar15 && len != 0) {
              iVar9 = bcmp(key,*(void **)(lVar14 + 8),len);
              bVar15 = iVar9 == 0;
            }
            if (bVar15) goto LAB_001ae80f;
            uVar10 = uVar10 - 1 & uVar10;
          } while (uVar10 != 0);
        }
        if ((*(byte *)(uVar12 * 0x10 + lVar3 + 0xf) &
            (&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
              is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
        lVar11 = uVar12 + uVar13;
        uVar13 = uVar13 + 1;
        uVar12 = lVar11 + 1U & uVar4;
      } while (uVar13 <= uVar4);
      lVar14 = 0;
LAB_001ae80f:
      if (lVar14 == 0) {
        if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
          detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>const&>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)this,(arrays_type *)this,pos0,hash,first);
          *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
        }
        else {
          detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>const&>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)this,hash,first);
        }
      }
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

void insert(InputIterator first, InputIterator last) {
        for (auto pos = first; pos != last; ++pos) {
            table_.emplace(*pos);
        }
    }